

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_buildBlockEntropyStats_literals
                 (void *src,size_t srcSize,ZSTD_hufCTables_t *prevHuf,ZSTD_hufCTables_t *nextHuf,
                 ZSTD_hufCTablesMetadata_t *hufMetadata,int disableLiteralsCompression,
                 void *workspace,size_t wkspSize)

{
  uint uVar1;
  int iVar2;
  ZSTD_hufCTables_t *pZVar3;
  void *code;
  size_t sVar4;
  size_t oldCSize;
  size_t hSize;
  size_t newCSize;
  size_t err_code_1;
  size_t maxBits;
  size_t err_code;
  size_t largest;
  size_t minLitSize;
  HUF_repeat repeat;
  uint huffLog;
  uint maxSymbolValue;
  size_t nodeWkspSize;
  BYTE *nodeWksp;
  size_t countWkspSize;
  uint *countWksp;
  BYTE *countWkspStart;
  BYTE *wkspEnd;
  BYTE *wkspStart;
  ZSTD_hufCTablesMetadata_t *pZStack_38;
  int disableLiteralsCompression_local;
  ZSTD_hufCTablesMetadata_t *hufMetadata_local;
  ZSTD_hufCTables_t *nextHuf_local;
  ZSTD_hufCTables_t *prevHuf_local;
  size_t srcSize_local;
  void *src_local;
  
  wkspEnd = (BYTE *)workspace;
  countWkspStart = (BYTE *)((long)workspace + wkspSize);
  countWksp = (uint *)workspace;
  countWkspSize = (size_t)workspace;
  nodeWksp = (BYTE *)0x400;
  nodeWkspSize = (long)workspace + 0x400;
  _huffLog = (long)countWkspStart - nodeWkspSize;
  repeat = 0xff;
  minLitSize._4_4_ = prevHuf->repeatMode;
  wkspStart._4_4_ = disableLiteralsCompression;
  pZStack_38 = hufMetadata;
  hufMetadata_local = (ZSTD_hufCTablesMetadata_t *)nextHuf;
  nextHuf_local = prevHuf;
  prevHuf_local = (ZSTD_hufCTables_t *)srcSize;
  srcSize_local = (size_t)src;
  memcpy(nextHuf,prevHuf,0x404);
  if (wkspStart._4_4_ == 0) {
    iVar2 = 0x3f;
    if (nextHuf_local->repeatMode == HUF_repeat_valid) {
      iVar2 = 6;
    }
    if ((ZSTD_hufCTables_t *)(long)iVar2 < prevHuf_local) {
      pZVar3 = (ZSTD_hufCTables_t *)
               HIST_count_wksp((uint *)countWkspSize,&repeat,(void *)srcSize_local,
                               (size_t)prevHuf_local,workspace,wkspSize);
      uVar1 = ERR_isError((size_t)pZVar3);
      src_local = pZVar3;
      if (uVar1 == 0) {
        if (pZVar3 == prevHuf_local) {
          pZStack_38->hType = set_rle;
          src_local = (void *)0x0;
        }
        else if ((ZSTD_hufCTables_t *)(((ulong)prevHuf_local >> 7) + 4) < pZVar3) {
          if ((minLitSize._4_4_ == HUF_repeat_check) &&
             (iVar2 = HUF_validateCTable(nextHuf_local->CTable,(uint *)countWkspSize,repeat),
             iVar2 == 0)) {
            minLitSize._4_4_ = HUF_repeat_none;
          }
          memset(hufMetadata_local,0,0x400);
          uVar1 = HUF_optimalTableLog(0xb,(size_t)prevHuf_local,repeat);
          code = (void *)HUF_buildCTable_wksp
                                   ((HUF_CElt *)hufMetadata_local,(uint *)countWkspSize,repeat,uVar1
                                    ,(void *)nodeWkspSize,_huffLog);
          uVar1 = ERR_isError((size_t)code);
          src_local = code;
          if (uVar1 == 0) {
            sVar4 = HUF_estimateCompressedSize
                              ((HUF_CElt *)hufMetadata_local,(uint *)countWkspSize,repeat);
            src_local = (void *)HUF_writeCTable_wksp
                                          (pZStack_38->hufDesBuffer,0x80,
                                           (HUF_CElt *)hufMetadata_local,repeat,(uint)code,
                                           (void *)nodeWkspSize,_huffLog);
            if (((minLitSize._4_4_ == HUF_repeat_none) ||
                (pZVar3 = (ZSTD_hufCTables_t *)
                          HUF_estimateCompressedSize
                                    (nextHuf_local->CTable,(uint *)countWkspSize,repeat),
                prevHuf_local <= pZVar3)) ||
               (((ZSTD_hufCTables_t *)((long)src_local + sVar4) < pZVar3 &&
                ((ZSTD_hufCTables_t *)((long)src_local + 0xcU) < prevHuf_local)))) {
              if ((ZSTD_hufCTables_t *)(sVar4 + (long)src_local) < prevHuf_local) {
                pZStack_38->hType = set_compressed;
                hufMetadata_local[7].hufDesBuffer[0xc] = '\x01';
                hufMetadata_local[7].hufDesBuffer[0xd] = '\0';
                hufMetadata_local[7].hufDesBuffer[0xe] = '\0';
                hufMetadata_local[7].hufDesBuffer[0xf] = '\0';
              }
              else {
                memcpy(hufMetadata_local,nextHuf_local,0x404);
                pZStack_38->hType = set_basic;
                src_local = (void *)0x0;
              }
            }
            else {
              memcpy(hufMetadata_local,nextHuf_local,0x404);
              pZStack_38->hType = set_repeat;
              src_local = (void *)0x0;
            }
          }
        }
        else {
          pZStack_38->hType = set_basic;
          src_local = (void *)0x0;
        }
      }
    }
    else {
      pZStack_38->hType = set_basic;
      src_local = (void *)0x0;
    }
  }
  else {
    pZStack_38->hType = set_basic;
    src_local = (void *)0x0;
  }
  return (size_t)src_local;
}

Assistant:

static size_t ZSTD_buildBlockEntropyStats_literals(void* const src, size_t srcSize,
                                            const ZSTD_hufCTables_t* prevHuf,
                                                  ZSTD_hufCTables_t* nextHuf,
                                                  ZSTD_hufCTablesMetadata_t* hufMetadata,
                                                  const int disableLiteralsCompression,
                                                  void* workspace, size_t wkspSize)
{
    BYTE* const wkspStart = (BYTE*)workspace;
    BYTE* const wkspEnd = wkspStart + wkspSize;
    BYTE* const countWkspStart = wkspStart;
    unsigned* const countWksp = (unsigned*)workspace;
    const size_t countWkspSize = (HUF_SYMBOLVALUE_MAX + 1) * sizeof(unsigned);
    BYTE* const nodeWksp = countWkspStart + countWkspSize;
    const size_t nodeWkspSize = wkspEnd-nodeWksp;
    unsigned maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    unsigned huffLog = HUF_TABLELOG_DEFAULT;
    HUF_repeat repeat = prevHuf->repeatMode;
    DEBUGLOG(5, "ZSTD_buildBlockEntropyStats_literals (srcSize=%zu)", srcSize);

    /* Prepare nextEntropy assuming reusing the existing table */
    ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));

    if (disableLiteralsCompression) {
        DEBUGLOG(5, "set_basic - disabled");
        hufMetadata->hType = set_basic;
        return 0;
    }

    /* small ? don't even attempt compression (speed opt) */
#ifndef COMPRESS_LITERALS_SIZE_MIN
#define COMPRESS_LITERALS_SIZE_MIN 63
#endif
    {   size_t const minLitSize = (prevHuf->repeatMode == HUF_repeat_valid) ? 6 : COMPRESS_LITERALS_SIZE_MIN;
        if (srcSize <= minLitSize) {
            DEBUGLOG(5, "set_basic - too small");
            hufMetadata->hType = set_basic;
            return 0;
        }
    }

    /* Scan input and build symbol stats */
    {   size_t const largest = HIST_count_wksp (countWksp, &maxSymbolValue, (const BYTE*)src, srcSize, workspace, wkspSize);
        FORWARD_IF_ERROR(largest, "HIST_count_wksp failed");
        if (largest == srcSize) {
            DEBUGLOG(5, "set_rle");
            hufMetadata->hType = set_rle;
            return 0;
        }
        if (largest <= (srcSize >> 7)+4) {
            DEBUGLOG(5, "set_basic - no gain");
            hufMetadata->hType = set_basic;
            return 0;
        }
    }

    /* Validate the previous Huffman table */
    if (repeat == HUF_repeat_check && !HUF_validateCTable((HUF_CElt const*)prevHuf->CTable, countWksp, maxSymbolValue)) {
        repeat = HUF_repeat_none;
    }

    /* Build Huffman Tree */
    ZSTD_memset(nextHuf->CTable, 0, sizeof(nextHuf->CTable));
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue);
    {   size_t const maxBits = HUF_buildCTable_wksp((HUF_CElt*)nextHuf->CTable, countWksp,
                                                    maxSymbolValue, huffLog,
                                                    nodeWksp, nodeWkspSize);
        FORWARD_IF_ERROR(maxBits, "HUF_buildCTable_wksp");
        huffLog = (U32)maxBits;
        {   /* Build and write the CTable */
            size_t const newCSize = HUF_estimateCompressedSize(
                    (HUF_CElt*)nextHuf->CTable, countWksp, maxSymbolValue);
            size_t const hSize = HUF_writeCTable_wksp(
                    hufMetadata->hufDesBuffer, sizeof(hufMetadata->hufDesBuffer),
                    (HUF_CElt*)nextHuf->CTable, maxSymbolValue, huffLog,
                    nodeWksp, nodeWkspSize);
            /* Check against repeating the previous CTable */
            if (repeat != HUF_repeat_none) {
                size_t const oldCSize = HUF_estimateCompressedSize(
                        (HUF_CElt const*)prevHuf->CTable, countWksp, maxSymbolValue);
                if (oldCSize < srcSize && (oldCSize <= hSize + newCSize || hSize + 12 >= srcSize)) {
                    DEBUGLOG(5, "set_repeat - smaller");
                    ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
                    hufMetadata->hType = set_repeat;
                    return 0;
                }
            }
            if (newCSize + hSize >= srcSize) {
                DEBUGLOG(5, "set_basic - no gains");
                ZSTD_memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
                hufMetadata->hType = set_basic;
                return 0;
            }
            DEBUGLOG(5, "set_compressed (hSize=%u)", (U32)hSize);
            hufMetadata->hType = set_compressed;
            nextHuf->repeatMode = HUF_repeat_check;
            return hSize;
        }
    }
}